

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::Btree_ExtractAndInsertNodeHandleSet_Test::
~Btree_ExtractAndInsertNodeHandleSet_Test(Btree_ExtractAndInsertNodeHandleSet_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Btree, ExtractAndInsertNodeHandleSet) {
        phmap::btree_set<int> src1 = {1, 2, 3, 4, 5};
        auto nh = src1.extract(src1.find(3));
        EXPECT_THAT(src1, ElementsAre(1, 2, 4, 5));
        phmap::btree_set<int> other;
        phmap::btree_set<int>::insert_return_type res = other.insert(std::move(nh));
        EXPECT_THAT(other, ElementsAre(3));
        EXPECT_EQ(res.position, other.find(3));
        EXPECT_TRUE(res.inserted);
        EXPECT_TRUE(res.node.empty());

        phmap::btree_set<int> src2 = {3, 4};
        nh = src2.extract(src2.find(3));
        EXPECT_THAT(src2, ElementsAre(4));
        res = other.insert(std::move(nh));
        EXPECT_THAT(other, ElementsAre(3));
        EXPECT_EQ(res.position, other.find(3));
        EXPECT_FALSE(res.inserted);
        ASSERT_FALSE(res.node.empty());
        EXPECT_EQ(res.node.value(), 3);
    }